

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

size_t prt_moves(wchar_t row,wchar_t col)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t wVar3;
  char *pcVar4;
  
  wVar1 = (player->state).num_moves;
  if (wVar1 < L'\x01') {
    if (L'\xffffffff' < wVar1) goto LAB_001c3789;
    wVar3 = -wVar1;
    pcVar4 = "Moves -%d ";
  }
  else {
    pcVar4 = "Moves +%d ";
    wVar3 = wVar1;
  }
  pcVar4 = format(pcVar4,(ulong)(uint)wVar3);
  c_put_str('\x16',pcVar4,row,col);
LAB_001c3789:
  if (wVar1 == L'\0') {
    sVar2 = 0;
  }
  else {
    wVar3 = -wVar1;
    if (L'\0' < wVar1) {
      wVar3 = wVar1;
    }
    sVar2 = (size_t)((uint)wVar3 / 10 + 9);
  }
  return sVar2;
}

Assistant:

static size_t prt_moves(int row, int col)
{
	int i = player->state.num_moves;

	/* 1 move is normal and requires no display */
	if (i > 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves +%d ", i), row, col);
	} else if (i < 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves -%d ", ABS(i)), row, col);
	}

	/* Shouldn't be double digits, but be paranoid */
	return (i != 0) ? (9 + ABS(i) / 10) : 0;
}